

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxShellsort<int,soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>>
               (int *keys,int end,
               Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *compare,int start)

{
  int iVar1;
  int i1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  type t;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  lVar4 = 2;
  do {
    iVar1 = SPxShellsort<int,_soplex::Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ::incs[lVar4];
    lVar5 = (long)start + (long)iVar1;
    lVar6 = lVar5;
    iVar7 = start;
    if ((int)lVar5 <= end) {
      do {
        i1 = keys[lVar6];
        iVar3 = (int)lVar6;
        iVar8 = iVar7;
        if (lVar5 <= lVar6) {
          do {
            Compare<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator()((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_a0,compare,i1,keys[iVar8]);
            iVar3 = iVar8;
            if (local_a0.fpclass == cpp_dec_float_NaN) break;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&local_68,0,(type *)0x0);
            iVar2 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_a0,&local_68);
            if (-1 < iVar2) break;
            keys[iVar1 + iVar8] = keys[iVar8];
            iVar3 = iVar8 - iVar1;
            bVar9 = (int)lVar5 <= iVar8;
            iVar8 = iVar3;
          } while (bVar9);
          iVar3 = iVar3 + iVar1;
        }
        keys[iVar3] = i1;
        lVar6 = lVar6 + 1;
        iVar7 = iVar7 + 1;
      } while (end + 1 != (int)lVar6);
    }
    bVar9 = lVar4 == 0;
    lVar4 = lVar4 + -1;
    if (bVar9) {
      return;
    }
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}